

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O1

OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *jp2,OPJ_BYTE *p_pclr_header_data,OPJ_UINT32 p_pclr_header_size
                          ,opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 *pOVar1;
  opj_jp2_pclr_t *poVar2;
  ulong uVar3;
  OPJ_BYTE *p_buffer;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  OPJ_UINT32 l_value;
  uint local_64;
  OPJ_UINT32 *local_60;
  OPJ_UINT32 *local_58;
  uint local_4c;
  ulong local_48;
  OPJ_UINT32 *local_40;
  ulong local_38;
  
  if (p_pclr_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_pclr_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                  ,0x48f,
                  "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (jp2 != (opj_jp2_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                    ,0x491,
                    "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    if ((2 < p_pclr_header_size) && ((jp2->color).jp2_pclr == (opj_jp2_pclr_t *)0x0)) {
      opj_read_bytes_LE(p_pclr_header_data,&local_64,2);
      uVar4 = local_64 & 0xffff;
      if (uVar4 - 0x401 < 0xfffffc00) {
        opj_event_msg(p_manager,1,"Invalid PCLR box. Reports %d entries\n",(ulong)uVar4);
      }
      else {
        local_4c = local_64;
        opj_read_bytes_LE(p_pclr_header_data + 2,&local_64,1);
        uVar3 = (ulong)(ushort)local_64;
        if (uVar3 == 0) {
          opj_event_msg(p_manager,1,"Invalid PCLR box. Reports 0 palette columns\n");
        }
        else if (((local_64 & 0xffff) + 3 <= p_pclr_header_size) &&
                (local_60 = (OPJ_UINT32 *)opj_malloc((ulong)(uVar4 * (local_64 & 0xffff) * 4)),
                local_60 != (OPJ_UINT32 *)0x0)) {
          local_40 = (OPJ_UINT32 *)opj_malloc(uVar3);
          pOVar1 = local_60;
          if (local_40 != (OPJ_UINT32 *)0x0) {
            local_48 = uVar3;
            pOVar1 = (OPJ_UINT32 *)opj_malloc(uVar3);
            if (pOVar1 == (OPJ_UINT32 *)0x0) {
              opj_free(local_60);
              pOVar1 = local_40;
            }
            else {
              local_58 = pOVar1;
              poVar2 = (opj_jp2_pclr_t *)opj_malloc(0x28);
              pOVar1 = local_40;
              if (poVar2 != (opj_jp2_pclr_t *)0x0) {
                poVar2->channel_sign = (OPJ_BYTE *)local_58;
                poVar2->channel_size = (OPJ_BYTE *)local_40;
                poVar2->entries = local_60;
                poVar2->nr_entries = (OPJ_UINT16)local_4c;
                poVar2->nr_channels = (byte)local_64;
                poVar2->cmap = (opj_jp2_cmap_comp_t *)0x0;
                (jp2->color).jp2_pclr = poVar2;
                local_38 = local_48 & 0xffffffff;
                uVar3 = 0;
                do {
                  uVar5 = uVar3;
                  opj_read_bytes_LE(p_pclr_header_data + uVar5 + 3,&local_64,1);
                  *(byte *)((long)pOVar1 + uVar5) = ((byte)local_64 & 0x7f) + 1;
                  *(byte *)((long)local_58 + uVar5) = (byte)local_64 >> 7;
                  uVar3 = uVar5 + 1;
                } while (local_38 != uVar5 + 1);
                if (uVar4 != 0) {
                  p_buffer = p_pclr_header_data + uVar5 + 4;
                  local_58 = (OPJ_UINT32 *)0x0;
                  do {
                    lVar6 = 0;
                    do {
                      uVar4 = *(byte *)((long)pOVar1 + lVar6) + 7 >> 3;
                      if (3 < uVar4) {
                        uVar4 = 4;
                      }
                      if ((long)(ulong)p_pclr_header_size <
                          (long)(p_buffer + ((ulong)uVar4 - (long)p_pclr_header_data))) {
                        return 0;
                      }
                      opj_read_bytes_LE(p_buffer,&local_64,uVar4);
                      p_buffer = p_buffer + uVar4;
                      *local_60 = local_64;
                      local_60 = local_60 + 1;
                      lVar6 = lVar6 + 1;
                      pOVar1 = local_40;
                    } while ((ushort)lVar6 < (ushort)local_48);
                    uVar4 = (int)local_58 + 1;
                    local_58 = (OPJ_UINT32 *)(ulong)uVar4;
                    if ((ushort)local_4c <= (ushort)uVar4) {
                      return 1;
                    }
                  } while( true );
                }
                return 1;
              }
              opj_free(local_60);
              opj_free(pOVar1);
              pOVar1 = local_58;
            }
          }
          opj_free(pOVar1);
        }
      }
    }
    return 0;
  }
  __assert_fail("jp2 != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/jp2.c"
                ,0x490,
                "OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
               );
}

Assistant:

static OPJ_BOOL opj_jp2_read_pclr(opj_jp2_t *jp2,
                                  OPJ_BYTE * p_pclr_header_data,
                                  OPJ_UINT32 p_pclr_header_size,
                                  opj_event_mgr_t * p_manager
                                 )
{
    opj_jp2_pclr_t *jp2_pclr;
    OPJ_BYTE *channel_size, *channel_sign;
    OPJ_UINT32 *entries;
    OPJ_UINT16 nr_entries, nr_channels;
    OPJ_UINT16 i, j;
    OPJ_UINT32 l_value;
    OPJ_BYTE *orig_header_data = p_pclr_header_data;

    /* preconditions */
    assert(p_pclr_header_data != 00);
    assert(jp2 != 00);
    assert(p_manager != 00);
    (void)p_pclr_header_size;

    if (jp2->color.jp2_pclr) {
        return OPJ_FALSE;
    }

    if (p_pclr_header_size < 3) {
        return OPJ_FALSE;
    }

    opj_read_bytes(p_pclr_header_data, &l_value, 2);    /* NE */
    p_pclr_header_data += 2;
    nr_entries = (OPJ_UINT16) l_value;
    if ((nr_entries == 0U) || (nr_entries > 1024U)) {
        opj_event_msg(p_manager, EVT_ERROR, "Invalid PCLR box. Reports %d entries\n",
                      (int)nr_entries);
        return OPJ_FALSE;
    }

    opj_read_bytes(p_pclr_header_data, &l_value, 1);    /* NPC */
    ++p_pclr_header_data;
    nr_channels = (OPJ_UINT16) l_value;
    if (nr_channels == 0U) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Invalid PCLR box. Reports 0 palette columns\n");
        return OPJ_FALSE;
    }

    if (p_pclr_header_size < 3 + (OPJ_UINT32)nr_channels) {
        return OPJ_FALSE;
    }

    entries = (OPJ_UINT32*) opj_malloc(sizeof(OPJ_UINT32) * nr_channels *
                                       nr_entries);
    if (!entries) {
        return OPJ_FALSE;
    }
    channel_size = (OPJ_BYTE*) opj_malloc(nr_channels);
    if (!channel_size) {
        opj_free(entries);
        return OPJ_FALSE;
    }
    channel_sign = (OPJ_BYTE*) opj_malloc(nr_channels);
    if (!channel_sign) {
        opj_free(entries);
        opj_free(channel_size);
        return OPJ_FALSE;
    }

    jp2_pclr = (opj_jp2_pclr_t*)opj_malloc(sizeof(opj_jp2_pclr_t));
    if (!jp2_pclr) {
        opj_free(entries);
        opj_free(channel_size);
        opj_free(channel_sign);
        return OPJ_FALSE;
    }

    jp2_pclr->channel_sign = channel_sign;
    jp2_pclr->channel_size = channel_size;
    jp2_pclr->entries = entries;
    jp2_pclr->nr_entries = nr_entries;
    jp2_pclr->nr_channels = (OPJ_BYTE) l_value;
    jp2_pclr->cmap = NULL;

    jp2->color.jp2_pclr = jp2_pclr;

    for (i = 0; i < nr_channels; ++i) {
        opj_read_bytes(p_pclr_header_data, &l_value, 1);    /* Bi */
        ++p_pclr_header_data;

        channel_size[i] = (OPJ_BYTE)((l_value & 0x7f) + 1);
        channel_sign[i] = (l_value & 0x80) ? 1 : 0;
    }

    for (j = 0; j < nr_entries; ++j) {
        for (i = 0; i < nr_channels; ++i) {
            OPJ_UINT32 bytes_to_read = (OPJ_UINT32)((channel_size[i] + 7) >> 3);

            if (bytes_to_read > sizeof(OPJ_UINT32)) {
                bytes_to_read = sizeof(OPJ_UINT32);
            }
            if ((ptrdiff_t)p_pclr_header_size < (ptrdiff_t)(p_pclr_header_data -
                    orig_header_data) + (ptrdiff_t)bytes_to_read) {
                return OPJ_FALSE;
            }

            opj_read_bytes(p_pclr_header_data, &l_value, bytes_to_read);    /* Cji */
            p_pclr_header_data += bytes_to_read;
            *entries = (OPJ_UINT32) l_value;
            entries++;
        }
    }

    return OPJ_TRUE;
}